

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O2

char * nsvg__parseNumber(char *s,char *it,int size)

{
  char cVar1;
  int iVar2;
  byte bVar3;
  long lVar4;
  
  cVar1 = *s;
  if ((cVar1 == '-') || (iVar2 = 0, cVar1 == '+')) {
    *it = cVar1;
    s = s + 1;
    iVar2 = 1;
  }
  for (; bVar3 = *s, bVar3 != 0; s = (char *)((byte *)s + 1)) {
    if ((byte)(bVar3 - 0x3a) < 0xf6) {
      if (bVar3 != 0x2e) goto LAB_00118f6f;
      bVar3 = 0x2e;
      goto joined_r0x00118f46;
    }
    if (iVar2 < 0x3f) {
      lVar4 = (long)iVar2;
      iVar2 = iVar2 + 1;
      it[lVar4] = bVar3;
    }
  }
  goto LAB_00118fc5;
  while (0xf5 < (byte)(bVar3 - 0x3a)) {
joined_r0x00118f46:
    if (iVar2 < 0x3f) {
      lVar4 = (long)iVar2;
      iVar2 = iVar2 + 1;
      it[lVar4] = bVar3;
    }
    s = (char *)((byte *)s + 1);
    bVar3 = *s;
    if (bVar3 == 0) goto LAB_00118fc5;
  }
LAB_00118f6f:
  if ((bVar3 | 0x20) == 0x65) {
    if (iVar2 < 0x3f) {
      lVar4 = (long)iVar2;
      iVar2 = iVar2 + 1;
      it[lVar4] = bVar3;
    }
    bVar3 = ((byte *)s)[1];
    if ((bVar3 != 0x2d) && (bVar3 != 0x2b)) goto LAB_00118fa8;
    if (iVar2 < 0x3f) {
      lVar4 = (long)iVar2;
      iVar2 = iVar2 + 1;
      it[lVar4] = bVar3;
    }
    for (s = (char *)((byte *)s + 2); 0xf5 < (byte)(*s - 0x3aU); s = (char *)((byte *)s + 1)) {
      if (iVar2 < 0x3f) {
        lVar4 = (long)iVar2;
        iVar2 = iVar2 + 1;
        it[lVar4] = *s;
      }
LAB_00118fa8:
    }
  }
LAB_00118fc5:
  it[iVar2] = '\0';
  return s;
}

Assistant:

static const char* nsvg__parseNumber(const char* s, char* it, const int size)
{
	const int last = size-1;
	int i = 0;

	// sign
	if (*s == '-' || *s == '+') {
		if (i < last) it[i++] = *s;
		s++;
	}
	// integer part
	while (*s && nsvg__isdigit(*s)) {
		if (i < last) it[i++] = *s;
		s++;
	}
	if (*s == '.') {
		// decimal point
		if (i < last) it[i++] = *s;
		s++;
		// fraction part
		while (*s && nsvg__isdigit(*s)) {
			if (i < last) it[i++] = *s;
			s++;
		}
	}
	// exponent
	if (*s == 'e' || *s == 'E') {
		if (i < last) it[i++] = *s;
		s++;
		if (*s == '-' || *s == '+') {
			if (i < last) it[i++] = *s;
			s++;
		}
		while (*s && nsvg__isdigit(*s)) {
			if (i < last) it[i++] = *s;
			s++;
		}
	}
	it[i] = '\0';

	return s;
}